

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMDocumentImpl::removeChild(DOMDocumentImpl *this)

{
  DOMNode *in_RSI;
  
  removeChild((DOMDocumentImpl *)&this[-1].fNodeIterators,in_RSI);
  return;
}

Assistant:

DOMNode *DOMDocumentImpl::removeChild(DOMNode *oldChild)
{
    fParent.removeChild(oldChild);

    // If remove succeeded, un-cache the kid appropriately
    if(oldChild->getNodeType() == DOMNode::ELEMENT_NODE)
        fDocElement=0;
    else if(oldChild->getNodeType() == DOMNode::DOCUMENT_TYPE_NODE)
        fDocType=0;

    return oldChild;
}